

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void luaC_fullgc(lua_State *L,int isemergency)

{
  global_State *g_00;
  undefined1 auVar1 [16];
  GCObject **ppGVar2;
  ulong uVar3;
  long lVar4;
  global_State *g;
  
  g_00 = L->l_G;
  if (isemergency != 0) {
    g_00->gckind = '\x01';
  }
  if (g_00->gcstate < 2) {
    g_00->gcstate = '\x02';
    ppGVar2 = sweeplist(L,&g_00->allgc,1);
    g_00->sweepgc = ppGVar2;
  }
  luaC_runtilstate(L,0x80);
  luaC_runtilstate(L,-0x81);
  luaC_runtilstate(L,0x40);
  luaC_runtilstate(L,0x80);
  g_00->gckind = '\0';
  uVar3 = g_00->GCestimate / 100;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  lVar4 = uVar3 * (long)g_00->gcpause;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar1,0) <= (long)g_00->gcpause)
  {
    lVar4 = 0x7fffffffffffffff;
  }
  luaE_setdebt(g_00,(g_00->GCdebt + g_00->totalbytes) - lVar4);
  return;
}

Assistant:

void luaC_fullgc (lua_State *L, int isemergency) {
  global_State *g = G(L);
  lua_assert(!g->gcemergency);
  g->gcemergency = isemergency;  /* set flag */
  if (g->gckind == KGC_INC)
    fullinc(L, g);
  else
    fullgen(L, g);
  g->gcemergency = 0;
}